

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O0

idx_t __thiscall
duckdb::RowMatcher::Match
          (RowMatcher *this,DataChunk *lhs,vector<duckdb::TupleDataVectorFormat,_true> *lhs_formats,
          SelectionVector *sel,idx_t count,TupleDataLayout *rhs_layout,Vector *rhs_row_locations,
          SelectionVector *no_match_sel,idx_t *no_match_count,vector<unsigned_long,_true> *columns)

{
  match_function_t p_Var1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  const_reference pvVar6;
  SelectionVector *in_RCX;
  vector<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_> *in_RDI;
  idx_t in_R8;
  TupleDataLayout *in_R9;
  Vector *in_stack_00000008;
  SelectionVector *in_stack_00000010;
  idx_t *in_stack_00000018;
  value_type *match_function;
  value_type col_idx;
  idx_t fun_idx;
  idx_t in_stack_ffffffffffffff68;
  idx_t iVar7;
  vector<duckdb::MatchFunction,_true> *in_stack_ffffffffffffff70;
  ulong local_48;
  idx_t local_38;
  
  local_48 = 0;
  local_38 = in_R8;
  while( true ) {
    sVar2 = ::std::vector<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>::size
                      (in_RDI);
    if (sVar2 <= local_48) break;
    pvVar3 = vector<unsigned_long,_true>::operator[]
                       ((vector<unsigned_long,_true> *)in_stack_ffffffffffffff70,
                        in_stack_ffffffffffffff68);
    iVar7 = *pvVar3;
    pvVar4 = vector<duckdb::MatchFunction,_true>::operator[]
                       (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    p_Var1 = pvVar4->function;
    pvVar5 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_ffffffffffffff70,
                        in_stack_ffffffffffffff68);
    pvVar6 = vector<duckdb::TupleDataVectorFormat,_true>::operator[]
                       ((vector<duckdb::TupleDataVectorFormat,_true> *)in_stack_ffffffffffffff70,
                        in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff70 = &pvVar4->child_functions;
    local_38 = (*p_Var1)(pvVar5,pvVar6,in_RCX,local_38,in_R9,in_stack_00000008,iVar7,
                         in_stack_ffffffffffffff70,in_stack_00000010,in_stack_00000018);
    local_48 = local_48 + 1;
    in_stack_ffffffffffffff68 = iVar7;
  }
  return local_38;
}

Assistant:

idx_t RowMatcher::Match(DataChunk &lhs, const vector<TupleDataVectorFormat> &lhs_formats, SelectionVector &sel,
                        idx_t count, const TupleDataLayout &rhs_layout, Vector &rhs_row_locations,
                        SelectionVector *no_match_sel, idx_t &no_match_count, const vector<column_t> &columns) {
	D_ASSERT(!match_functions.empty());

	// The column_ids must have the same size as the match_functions vector
	D_ASSERT(columns.size() == match_functions.size());

	// The largest column_id must be smaller than the number columns to not cause an out-of-bounds error
	D_ASSERT(*max_element(columns.begin(), columns.end()) < lhs.ColumnCount());

	for (idx_t fun_idx = 0; fun_idx < match_functions.size(); fun_idx++) {
		// if we only care about specific columns, we need to use the column_ids to get the correct column index
		// otherwise, we just use the fun_idx
		const auto col_idx = columns[fun_idx];

		const auto &match_function = match_functions[fun_idx];
		count =
		    match_function.function(lhs.data[col_idx], lhs_formats[col_idx], sel, count, rhs_layout, rhs_row_locations,
		                            col_idx, match_function.child_functions, no_match_sel, no_match_count);
	}
	return count;
}